

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGClient.cpp
# Opt level: O1

bool __thiscall
ViconCGStreamClientSDK::VCGClient::SetApexDeviceFeedback(VCGClient *this,uint i_DeviceID,bool i_bOn)

{
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *this_00;
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  pointer psVar3;
  VViconCGStreamClient *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  _Base_ptr p_Var4;
  const_iterator __position;
  undefined7 in_register_00000011;
  _Base_ptr p_Var5;
  pointer psVar6;
  bool bVar7;
  uint local_34;
  
  this_00 = &this->m_HapticDeviceOnList;
  p_Var2 = (this->m_HapticDeviceOnList)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->m_HapticDeviceOnList)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = &p_Var1->_M_header;
  if ((int)CONCAT71(in_register_00000011,i_bOn) == 0) {
    for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[bVar7]) {
      bVar7 = p_Var2[1]._M_color < i_DeviceID;
      if (!bVar7) {
        p_Var5 = p_Var2;
      }
    }
    __position._M_node = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
       (__position._M_node = p_Var5, i_DeviceID < p_Var5[1]._M_color)) {
      __position._M_node = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)__position._M_node == p_Var1) {
      return false;
    }
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)this_00,__position);
  }
  else {
    for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[bVar7]) {
      bVar7 = p_Var2[1]._M_color < i_DeviceID;
      if (!bVar7) {
        p_Var5 = p_Var2;
      }
    }
    p_Var4 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && (p_Var4 = p_Var5, i_DeviceID < p_Var5[1]._M_color))
    {
      p_Var4 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var4 != p_Var1) {
      return false;
    }
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)this_00,&local_34);
  }
  psVar3 = (this->m_pClients).
           super__Vector_base<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (this->m_pClients).
                super__Vector_base<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar3; psVar6 = psVar6 + 1) {
    this_01 = (psVar6->super___shared_ptr<VViconCGStreamClient,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_02 = (psVar6->super___shared_ptr<VViconCGStreamClient,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_02->_M_use_count = this_02->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_02->_M_use_count = this_02->_M_use_count + 1;
      }
    }
    VViconCGStreamClient::SetApexDeviceFeedback(this_01,this_00);
    if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
    }
  }
  return true;
}

Assistant:

bool VCGClient::SetApexDeviceFeedback( unsigned int i_DeviceID, bool i_bOn )
{
  if( i_bOn )
  {
    if( m_HapticDeviceOnList.find( i_DeviceID ) != m_HapticDeviceOnList.end() )
    {
      return false;
    }
    m_HapticDeviceOnList.insert( i_DeviceID );
  }
  else
  {
    std::set< unsigned int >::iterator It = m_HapticDeviceOnList.find( i_DeviceID );
    if( It== m_HapticDeviceOnList.end() )
    {
      return false;
    } 
    m_HapticDeviceOnList.erase( It );
    
  }

  for( auto pClient : m_pClients )
  {
    pClient->SetApexDeviceFeedback( m_HapticDeviceOnList );
  }

  return true;
}